

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.hpp
# Opt level: O2

bool __thiscall
pstore::command_line::
list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
::simple_value(list<(anonymous_namespace)::enumeration,_pstore::command_line::parser<(anonymous_namespace)::enumeration,_void>_>
               *this,string *v)

{
  size_t *psVar1;
  int iVar2;
  pointer plVar3;
  __type _Var4;
  _List_node_base *p_Var5;
  pointer plVar6;
  long lVar7;
  long lVar8;
  pointer __rhs;
  
  __rhs = (this->parser_).super_parser_base.literals_.
          super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
          ._M_impl.super__Vector_impl_data._M_start;
  plVar3 = (this->parser_).super_parser_base.literals_.
           super__Vector_base<pstore::command_line::literal,_std::allocator<pstore::command_line::literal>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)plVar3 - (long)__rhs;
  for (lVar8 = lVar7 / 0x48 >> 2; plVar6 = __rhs, 0 < lVar8; lVar8 = lVar8 + -1) {
    _Var4 = std::operator==(v,&__rhs->name);
    if (_Var4) goto LAB_00123b44;
    _Var4 = std::operator==(v,&__rhs[1].name);
    plVar6 = __rhs + 1;
    if (_Var4) goto LAB_00123b44;
    _Var4 = std::operator==(v,&__rhs[2].name);
    plVar6 = __rhs + 2;
    if (_Var4) goto LAB_00123b44;
    _Var4 = std::operator==(v,&__rhs[3].name);
    plVar6 = __rhs + 3;
    if (_Var4) goto LAB_00123b44;
    __rhs = __rhs + 4;
    lVar7 = lVar7 + -0x120;
  }
  lVar7 = lVar7 / 0x48;
  if (lVar7 != 1) {
    if (lVar7 != 2) {
      if (lVar7 != 3) {
        return false;
      }
      _Var4 = std::operator==(v,&__rhs->name);
      if (_Var4) goto LAB_00123b44;
      plVar6 = __rhs + 1;
    }
    _Var4 = std::operator==(v,&plVar6->name);
    if (_Var4) goto LAB_00123b44;
    __rhs = plVar6 + 1;
  }
  _Var4 = std::operator==(v,&__rhs->name);
  plVar6 = __rhs;
  if (!_Var4) {
    plVar6 = plVar3;
  }
LAB_00123b44:
  if (plVar6 == plVar3) {
    return false;
  }
  iVar2 = plVar6->value;
  p_Var5 = (_List_node_base *)operator_new(0x18);
  *(int *)&p_Var5[1]._M_next = iVar2;
  std::__detail::_List_node_base::_M_hook(p_Var5);
  psVar1 = &(this->values_).
            super__List_base<(anonymous_namespace)::enumeration,_std::allocator<(anonymous_namespace)::enumeration>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return true;
}

Assistant:

bool list<T, Parser>::simple_value (std::string const & v) {
            if (maybe<T> m = parser_ (v)) {
                values_.push_back (m.value ());
                return true;
            }
            return false;
        }